

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picnic3_tree.c
# Opt level: O0

int addMerkleNodes(tree_t *tree,uint16_t *missingLeaves,size_t missingLeavesSize,uint8_t *input,
                  size_t inputSize)

{
  uint *__ptr;
  size_t *in_RSI;
  size_t in_RDI;
  long in_R8;
  size_t i;
  uint *revealed;
  size_t revealedSize;
  int ret;
  int local_2c;
  
  local_2c = -1;
  __ptr = getRevealedMerkleNodes((tree_t *)revealed,(uint16_t *)i,in_RDI,in_RSI);
  if ((__ptr != (uint *)0x0) && (in_R8 == 0)) {
    local_2c = 0;
  }
  free(__ptr);
  return local_2c;
}

Assistant:

int addMerkleNodes(tree_t* tree, uint16_t* missingLeaves, size_t missingLeavesSize, uint8_t* input,
                   size_t inputSize) {
  assert(missingLeavesSize < tree->numLeaves);

  int ret             = -1;
  size_t revealedSize = 0;
  unsigned int* revealed =
      getRevealedMerkleNodes(tree, missingLeaves, missingLeavesSize, &revealedSize);
  if (!revealed) {
    goto Exit;
  }
  assert(!contains(revealed, revealedSize, 0));

  if (inputSize != revealedSize * tree->dataSize) {
    goto Exit;
  }

  /* Deserialize input */
  for (size_t i = 0; i < revealedSize; i++) {
    memcpy(&tree->nodes[revealed[i] * tree->dataSize], input, tree->dataSize);
    input += tree->dataSize;
    markNode(tree, revealed[i]);
  }
  ret = 0;

Exit:
  free(revealed);

  return ret;
}